

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O3

void Tim_ManSetPreviousTravIdBoxOutputs(Tim_Man_t *p,int iBox)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Tim_Obj_t *pTVar5;
  long lVar6;
  
  if ((-1 < iBox) && (iBox < p->vBoxes->nSize)) {
    pvVar4 = p->vBoxes->pArray[(uint)iBox];
    iVar1 = *(int *)((long)pvVar4 + 0xc);
    if ((0 < (long)iVar1) && (pTVar5 = p->pCis, pTVar5 != (Tim_Obj_t *)0x0)) {
      iVar2 = *(int *)((long)pvVar4 + 8);
      iVar3 = p->nTravIds;
      lVar6 = 0;
      do {
        pTVar5[*(int *)((long)pvVar4 + lVar6 * 4 + (long)iVar2 * 4 + 0x1c)].TravId = iVar3 + -1;
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Tim_ManSetPreviousTravIdBoxOutputs( Tim_Man_t * p, int iBox )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    int i;
    pBox = Tim_ManBox( p, iBox );
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        pObj->TravId = p->nTravIds - 1;
}